

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_339cb0::Pl_Track::~Pl_Track(Pl_Track *this)

{
  Pl_Track *this_local;
  
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_Track(char const* identifier, Pipeline* next) :
            Pipeline(identifier, next)
        {
            if (!next) {
                throw std::logic_error("Attempt to create Pl_Track with nullptr as next");
            }
        }